

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  string *psVar1;
  char *pcVar2;
  string barf;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,source,&local_41);
  psVar1 = cmMakefile::ExpandVariablesInString
                     ((cmMakefile *)arg,&local_40,escapeQuotes != 0,atOnly != 0,false,(char *)0x0,-1
                      ,false,false);
  pcVar2 = strdup((psVar1->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  return pcVar2;
}

Assistant:

static char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                             int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string const& result =
    mf->ExpandVariablesInString(barf, escapeQuotes != 0, atOnly != 0);
  return strdup(result.c_str());
}